

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_A_ParamSet.c
# Opt level: O0

void var_smul_rwnaf(pt_aff_t_conflict4 *out,uchar *scalar,pt_aff_t_conflict4 *P)

{
  uint64_t *in_RDI;
  pt_prj_t_conflict4 precomp [16];
  pt_prj_t_conflict4 lut;
  pt_prj_t_conflict4 Q;
  int8_t rnaf [103];
  int is_neg;
  int diff;
  int d;
  int j;
  int i;
  pt_aff_t_conflict4 *in_stack_ffffffffffffe8e8;
  pt_prj_t_conflict4 *in_stack_ffffffffffffe8f0;
  uint64_t *in_stack_ffffffffffffe938;
  uint64_t *in_stack_ffffffffffffe940;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 in_stack_ffffffffffffe94f;
  uint64_t *in_stack_ffffffffffffe950;
  pt_prj_t_conflict4 *in_stack_ffffffffffffe988;
  pt_prj_t_conflict4 *in_stack_ffffffffffffe990;
  undefined1 auStack_1628 [144];
  pt_prj_t_conflict4 *in_stack_ffffffffffffea68;
  pt_prj_t_conflict4 *in_stack_ffffffffffffea70;
  pt_prj_t_conflict4 *in_stack_ffffffffffffea90;
  pt_prj_t_conflict4 *in_stack_ffffffffffffea98;
  pt_prj_t_conflict4 *in_stack_ffffffffffffeaa0;
  uint64_t *in_stack_ffffffffffffecf8;
  uint64_t *in_stack_ffffffffffffed00;
  uint64_t *in_stack_fffffffffffff4d0;
  uint64_t *in_stack_fffffffffffff4d8;
  uint64_t *in_stack_fffffffffffff4e0;
  uint64_t local_318 [10];
  undefined1 auStack_2c8 [80];
  uint64_t auStack_278 [10];
  undefined1 auStack_228 [80];
  undefined1 local_1d8 [320];
  char local_98 [102];
  char local_32;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  int local_1c;
  uint64_t *local_8;
  
  local_8 = in_RDI;
  memset(local_98,0,0x67);
  memset(local_1d8,0,0x140);
  memset(local_318,0,0x140);
  precomp_wnaf(in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8);
  scalar_rwnaf((int8_t *)in_stack_ffffffffffffe8f0,(uchar *)in_stack_ffffffffffffe8e8);
  local_24 = local_32 + -1 >> 1;
  for (local_20 = 0; (int)local_20 < 0x10; local_20 = local_20 + 1) {
    local_28 = 1U - ((int)-(local_24 ^ local_20) >> 0x1f) & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
              (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
               in_stack_ffffffffffffe938);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
              (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
               in_stack_ffffffffffffe938);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
              (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
               in_stack_ffffffffffffe938);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
              (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
               in_stack_ffffffffffffe938);
  }
  for (local_1c = 0x65; -1 < local_1c; local_1c = local_1c + -1) {
    for (local_20 = 0; (int)local_20 < 5; local_20 = local_20 + 1) {
      point_double(in_stack_ffffffffffffea70,in_stack_ffffffffffffea68);
    }
    local_2c = (int)local_98[local_1c] >> 0x1f & 1;
    local_24 = (int)(((int)local_98[local_1c] ^ -local_2c) + local_2c + -1) >> 1;
    for (local_20 = 0; (int)local_20 < 0x10; local_20 = local_20 + 1) {
      local_28 = 1U - ((int)-(local_24 ^ local_20) >> 0x1f) & 1;
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
                 in_stack_ffffffffffffe938);
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
                 in_stack_ffffffffffffe938);
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
                 in_stack_ffffffffffffe938);
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
                 in_stack_ffffffffffffe938);
    }
    fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(local_8,local_318);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(local_8 + 0x14,auStack_278);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
              (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
               in_stack_ffffffffffffe938);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
              (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
               in_stack_ffffffffffffe938);
    point_add_proj(in_stack_ffffffffffffeaa0,in_stack_ffffffffffffea98,in_stack_ffffffffffffea90);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(local_318,(uint64_t *)&stack0xffffffffffffe8e8);
  memcpy(auStack_2c8,&stack0xffffffffffffe938,0x50);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(auStack_278,(uint64_t *)&stack0xffffffffffffe988);
  memcpy(auStack_228,auStack_1628,0x50);
  point_add_proj(in_stack_ffffffffffffeaa0,in_stack_ffffffffffffea98,in_stack_ffffffffffffea90);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
            (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
             in_stack_ffffffffffffe938);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
            (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
             in_stack_ffffffffffffe938);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
            (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
             in_stack_ffffffffffffe938);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
            (in_stack_ffffffffffffe950,in_stack_ffffffffffffe94f,in_stack_ffffffffffffe940,
             in_stack_ffffffffffffe938);
  point_double(in_stack_ffffffffffffea70,in_stack_ffffffffffffea68);
  point_double(in_stack_ffffffffffffea70,in_stack_ffffffffffffea68);
  point_edwards2legacy(in_stack_ffffffffffffe990,in_stack_ffffffffffffe988);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_inv(in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8)
  ;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  return;
}

Assistant:

static void var_smul_rwnaf(pt_aff_t *out, const unsigned char scalar[32],
                           const pt_aff_t *P) {
    int i, j, d, diff, is_neg;
    int8_t rnaf[52] = {0};
    pt_prj_t Q = {0}, lut = {0};
    pt_prj_t precomp[DRADIX / 2];

    precomp_wnaf(precomp, P);
    scalar_rwnaf(rnaf, scalar);

#if defined(_MSC_VER)
    /* result still unsigned: yes we know */
#pragma warning(push)
#pragma warning(disable : 4146)
#endif

    /* initialize accumulator to high digit */
    d = (rnaf[51] - 1) >> 1;
    for (j = 0; j < DRADIX / 2; j++) {
        diff = (1 - (-(d ^ j) >> (8 * sizeof(int) - 1))) & 1;
        fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_selectznz(Q.X, diff, Q.X,
                                                              precomp[j].X);
        fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_selectznz(Q.Y, diff, Q.Y,
                                                              precomp[j].Y);
        fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_selectznz(Q.Z, diff, Q.Z,
                                                              precomp[j].Z);
    }

    for (i = 50; i >= 0; i--) {
        for (j = 0; j < RADIX; j++) point_double(&Q, &Q);
        d = rnaf[i];
        /* is_neg = (d < 0) ? 1 : 0 */
        is_neg = (d >> (8 * sizeof(int) - 1)) & 1;
        /* d = abs(d) */
        d = (d ^ -is_neg) + is_neg;
        d = (d - 1) >> 1;
        for (j = 0; j < DRADIX / 2; j++) {
            diff = (1 - (-(d ^ j) >> (8 * sizeof(int) - 1))) & 1;
            fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_selectznz(
                lut.X, diff, lut.X, precomp[j].X);
            fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_selectznz(
                lut.Y, diff, lut.Y, precomp[j].Y);
            fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_selectznz(
                lut.Z, diff, lut.Z, precomp[j].Z);
        }
        /* negate lut point if digit is negative */
        fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_opp(out->Y, lut.Y);
        fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_selectznz(lut.Y, is_neg,
                                                              lut.Y, out->Y);
        point_add_proj(&Q, &Q, &lut);
    }

#if defined(_MSC_VER)
#pragma warning(pop)
#endif

    /* conditionally subtract P if the scalar was even */
    fe_copy(lut.X, precomp[0].X);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_opp(lut.Y, precomp[0].Y);
    fe_copy(lut.Z, precomp[0].Z);
    point_add_proj(&lut, &lut, &Q);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_selectznz(Q.X, scalar[0] & 1,
                                                          lut.X, Q.X);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_selectznz(Q.Y, scalar[0] & 1,
                                                          lut.Y, Q.Y);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_selectznz(Q.Z, scalar[0] & 1,
                                                          lut.Z, Q.Z);

    /* convert to affine -- NB depends on coordinate system */
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_inv(Q.Z, Q.Z);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(out->X, Q.X, Q.Z);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(out->Y, Q.Y, Q.Z);
}